

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O2

int __thiscall MeCab::Connector::open(Connector *this,char *__file,int __oflag,...)

{
  int iVar1;
  string filename;
  allocator local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  Param::get<std::__cxx11::string>(&local_48,(Param *)__file,"dicdir");
  std::__cxx11::string::string((string *)&local_68,"matrix.bin",&local_69);
  create_filename(&local_28,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  iVar1 = open(this,local_28._M_dataplus._M_p,0x152cec);
  std::__cxx11::string::~string((string *)&local_28);
  return iVar1;
}

Assistant:

bool Connector::open(const Param &param) {
  const std::string filename = create_filename
      (param.get<std::string>("dicdir"), MATRIX_FILE);
  return open(filename.c_str());
}